

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O0

int Am_Panel_Set_Old_Owner_To_Me_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Wrapper *value;
  Am_Value *list_value;
  Am_Object local_48 [3];
  undefined1 local_30 [8];
  Am_Value_List parts;
  Am_Object cmd;
  int ret;
  Am_Object *self_local;
  
  Am_Object::Am_Object((Am_Object *)&parts.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  Am_Object::Get_Object(local_48,(Am_Slot_Key)self,0xc5);
  Am_Object::operator=((Am_Object *)&parts.item,local_48);
  Am_Object::~Am_Object(local_48);
  bVar1 = Am_Object::Valid((Am_Object *)&parts.item);
  if (bVar1) {
    value = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set((Am_Object *)&parts.item,0x170,value,1);
  }
  list_value = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)local_30,list_value);
  iVar2 = set_parts_list_commands_old_owner((Am_Value_List *)local_30,self);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  Am_Object::~Am_Object((Am_Object *)&parts.item);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, Am_Panel_Set_Old_Owner_To_Me)
{
  int ret = 0;
  Am_Object cmd;
  Am_Value_List parts;
  cmd = self.Get_Object(Am_COMMAND);
  if (cmd.Valid()) {
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
    ret = 1;
  }
  parts = self.Get(Am_GRAPHICAL_PARTS);
  ret = set_parts_list_commands_old_owner(parts, self);

  //ret not used, different values just for debugging
  return ret;
}